

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_BrDeleteExplicitLastPass_Test::TestBody
          (InterpreterTestSuite_PC_BrDeleteExplicitLastPass_Test *this)

{
  Registry *pRVar1;
  bool bVar2;
  Status SVar3;
  string *this_00;
  char *expected_predicate_value;
  char *pcVar4;
  Status local_482;
  allocator local_481;
  allocator local_480;
  allocator local_47f;
  allocator local_47e;
  allocator local_47d;
  allocator local_47c;
  allocator local_47b;
  allocator local_47a;
  Status local_479;
  AssertionResult gtest_ar_8;
  DomainArray doms;
  NetworkArray nwks;
  string local_418;
  AssertionResult gtest_ar_1;
  Expression expr;
  BorderRouterArray bra;
  string local_370;
  State local_350;
  State local_34c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_348;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  UnixTime local_308;
  UnixTime local_300;
  string local_2f8;
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  bra.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&value,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&bra);
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&bra);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xa66,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&bra);
    this_00 = &value.mError.mMessage;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(bra.
         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
         ._M_impl.super__Vector_impl_data._M_start)->_vptr_BorderRouter[1])();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&value.mError.mMessage);
    pRVar1 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&bra,"127.0.0.1",&local_47a);
    local_328._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&expr,"1.1",&local_47b);
    ot::commissioner::BorderAgent::State::State(&local_34c,0,0,0,0,0);
    std::__cxx11::string::string((string *)&nwks,"net1",&local_47c);
    std::__cxx11::string::string((string *)&doms,"",&local_47d);
    std::__cxx11::string::string((string *)&gtest_ar_8,"",&local_47e);
    std::__cxx11::string::string((string *)&local_418,"",&local_47f);
    local_348._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_348._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_370,"domain1",&local_480);
    pcVar4 = "";
    std::__cxx11::string::string((string *)&local_2f8,"",&local_481);
    ot::commissioner::UnixTime::UnixTime(&local_300,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)&bra,0x4e21,(ByteArray *)&local_328,(string *)&expr,
               local_34c,(string *)&nwks,1,(string *)&doms,(string *)&gtest_ar_8,(Timestamp)0x0,0,
               &local_418,(ByteArray *)&local_348,&local_370,'\0',0,&local_2f8,local_300,0x103f);
    local_479 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&value);
    local_482 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_479,&local_482);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_370);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_348);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar_8);
    std::__cxx11::string::~string((string *)&doms);
    std::__cxx11::string::~string((string *)&nwks);
    std::__cxx11::string::~string((string *)&expr);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_328);
    std::__cxx11::string::~string((string *)&bra);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&value);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xa6a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      this_00 = (string *)&gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      pRVar1 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&bra,"127.0.0.2",&local_47a);
      local_328._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&expr,"1.1",&local_47b);
      ot::commissioner::BorderAgent::State::State(&local_350,0,0,0,0,0);
      std::__cxx11::string::string((string *)&nwks,"net2",&local_47c);
      std::__cxx11::string::string((string *)&doms,"",&local_47d);
      std::__cxx11::string::string((string *)&gtest_ar_8,"",&local_47e);
      std::__cxx11::string::string((string *)&local_418,"",&local_47f);
      local_348._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_348._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_370,"domain2",&local_480);
      pcVar4 = "";
      std::__cxx11::string::string((string *)&local_2f8,"",&local_481);
      ot::commissioner::UnixTime::UnixTime(&local_308,0);
      expected_predicate_value = (char *)(ulong)(uint)local_350;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&value,(string *)&bra,0x4e22,(ByteArray *)&local_328,(string *)&expr
                 ,local_350,(string *)&nwks,2,(string *)&doms,(string *)&gtest_ar_8,(Timestamp)0x0,0
                 ,&local_418,(ByteArray *)&local_348,&local_370,'\0',0,&local_2f8,local_308,0x103f);
      local_479 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&value);
      local_482 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_479,&local_482);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_370);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_348);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&gtest_ar_8);
      std::__cxx11::string::~string((string *)&doms);
      std::__cxx11::string::~string((string *)&nwks);
      std::__cxx11::string::~string((string *)&expr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_328);
      std::__cxx11::string::~string((string *)&bra);
      if (gtest_ar_1.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
        value.mError.mCode = kNone;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string((string *)&bra,"br delete 1",(allocator *)&doms);
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&nwks,&ctx.mInterpreter,(string *)&bra);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&expr,&nwks);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nwks);
        std::__cxx11::string::~string((string *)&bra);
        ot::commissioner::Interpreter::Eval((Value *)&bra,&ctx.mInterpreter,&expr);
        ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&bra);
        ot::commissioner::Interpreter::Value::~Value((Value *)&bra);
        bVar2 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(nwks.
                               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (!bVar2) {
          testing::Message::Message((Message *)&doms);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&bra,(internal *)&nwks,(AssertionResult *)0x27400f,"false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa75,(char *)bra.
                                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
          std::__cxx11::string::~string((string *)&bra);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&nwks.
                          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SVar3 = ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
                          (ctx.mRegistry,&bra);
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(doms.
                               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,SVar3);
        gtest_ar_8._0_8_ = gtest_ar_8._0_8_ & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwks,"ctx.mRegistry->GetAllBorderRouters(bra)",
                   "RegistryStatus::kSuccess",(Status *)&doms,&gtest_ar_8.success_);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)nwks.
                               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa77,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&nwks.
                          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(((long)bra.
                              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)bra.
                             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x188);
        gtest_ar_8._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&nwks,"bra.size()","1",(unsigned_long *)&doms,(int *)&gtest_ar_8);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)nwks.
                               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa78,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&nwks.
                          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)doms.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&nwks,"bra[0].mId.mId","0",
                   &((bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start)->mId).mId,(int *)&doms);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)nwks.
                               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa79,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&nwks.
                          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = (bool)ot::commissioner::persistent_storage::Registry::GetAllNetworks
                                (ctx.mRegistry,&nwks);
        gtest_ar_8.success_ = bVar2;
        local_418._M_dataplus._M_p = local_418._M_dataplus._M_p & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&doms,"ctx.mRegistry->GetAllNetworks(nwks)",
                   "RegistryStatus::kSuccess",&gtest_ar_8.success_,(Status *)&local_418);
        if ((char)doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&gtest_ar_8);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)doms.
                               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa7c,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_418,(Message *)&gtest_ar_8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_418);
          if (gtest_ar_8._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_8._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&doms.
                          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        gtest_ar_8._0_8_ =
             ((long)nwks.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)nwks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60;
        local_418._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&doms,"nwks.size()","1",(unsigned_long *)&gtest_ar_8,
                   (int *)&local_418);
        if ((char)doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&gtest_ar_8);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)doms.
                               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa7d,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_418,(Message *)&gtest_ar_8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_418);
          if (gtest_ar_8._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_8._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&doms.
                          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SVar3 = ot::commissioner::persistent_storage::Registry::GetAllDomains(ctx.mRegistry,&doms);
        local_418._M_dataplus._M_p._0_1_ = SVar3;
        local_370._M_dataplus._M_p._0_4_ = (uint)local_370._M_dataplus._M_p & 0xffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&gtest_ar_8,"ctx.mRegistry->GetAllDomains(doms)",
                   "RegistryStatus::kSuccess",(Status *)&local_418,(Status *)&local_370);
        if (gtest_ar_8.success_ == false) {
          testing::Message::Message((Message *)&local_418);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_8.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar_8.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_370,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa80,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_370,(Message *)&local_418);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
          if ((long *)local_418._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_418._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_8.message_);
        local_418._M_dataplus._M_p =
             (pointer)(((long)doms.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)doms.
                             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x28);
        local_370._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&gtest_ar_8,"doms.size()","1",(unsigned_long *)&local_418,
                   (int *)&local_370);
        if (gtest_ar_8.success_ == false) {
          testing::Message::Message((Message *)&local_418);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_8.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar_8.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_370,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa81,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_370,(Message *)&local_418);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
          if ((long *)local_418._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_418._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_8.message_);
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::~vector(&doms);
        std::
        vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ::~vector(&nwks);
        std::
        vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ::~vector(&bra);
        ot::commissioner::Interpreter::Value::~Value(&value);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&expr);
        goto LAB_00175d2d;
      }
      testing::Message::Message((Message *)&value);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xa6e,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      this_00 = (string *)&gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
LAB_00175d2d:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteExplicitLastPass)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete 1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 1);
    EXPECT_EQ(bra[0].mId.mId, 0);

    NetworkArray nwks;
    EXPECT_EQ(ctx.mRegistry->GetAllNetworks(nwks), RegistryStatus::kSuccess);
    EXPECT_EQ(nwks.size(), 1);

    DomainArray doms;
    EXPECT_EQ(ctx.mRegistry->GetAllDomains(doms), RegistryStatus::kSuccess);
    EXPECT_EQ(doms.size(), 1);
}